

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

void ProcessRows(VP8LDecoder *dec,int row)

{
  int iVar1;
  WEBP_CSP_MODE out_colorspace;
  int width;
  VP8Io *pVVar2;
  WebPDecBuffer *pWVar3;
  WebPRescaler *pWVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int stride;
  int iVar9;
  int iVar10;
  uint32_t *puVar11;
  uint8_t *rgba;
  uint32_t *puVar12;
  uint8_t *row_out;
  uint8_t *rgba_00;
  
  iVar10 = dec->last_row_;
  if (row - iVar10 != 0 && iVar10 <= row) {
    pVVar2 = dec->io_;
    puVar11 = dec->argb_cache_;
    stride = pVVar2->width * 4;
    ApplyInverseTransforms(dec,iVar10,row - iVar10,dec->pixels_ + (long)dec->width_ * (long)iVar10);
    iVar10 = dec->last_row_;
    iVar1 = pVVar2->crop_top;
    iVar7 = iVar10;
    if (iVar1 - iVar10 != 0 && iVar10 <= iVar1) {
      iVar7 = iVar1;
    }
    iVar5 = 0;
    if (iVar10 < iVar1) {
      iVar5 = (iVar1 - iVar10) * stride;
    }
    iVar10 = pVVar2->crop_bottom;
    if (row <= pVVar2->crop_bottom) {
      iVar10 = row;
    }
    puVar11 = (uint32_t *)((long)iVar5 + (long)puVar11);
    if (iVar10 - iVar7 != 0 && iVar7 <= iVar10) {
      puVar11 = puVar11 + pVVar2->crop_left;
      pVVar2->mb_y = iVar7 - iVar1;
      pVVar2->mb_w = pVVar2->crop_right - pVVar2->crop_left;
      pVVar2->mb_h = iVar10 - iVar7;
    }
    if (iVar7 < iVar10) {
      pWVar3 = dec->output_;
      out_colorspace = pWVar3->colorspace;
      if (out_colorspace < MODE_YUV) {
        lVar8 = (long)(pWVar3->u).RGBA.stride;
        rgba_00 = (pWVar3->u).RGBA.rgba + dec->last_out_row_ * lVar8;
        if (pVVar2->use_scaling == 0) {
          iVar10 = pVVar2->mb_h;
          if (0 < iVar10) {
            iVar1 = pVVar2->mb_w;
            iVar7 = iVar10 + 1;
            do {
              VP8LConvertFromBGRA(puVar11,iVar1,out_colorspace,rgba_00);
              puVar11 = (uint32_t *)((long)puVar11 + (long)stride);
              rgba_00 = rgba_00 + lVar8;
              iVar7 = iVar7 + -1;
            } while (1 < iVar7);
          }
        }
        else {
          iVar1 = pVVar2->mb_h;
          if (iVar1 < 1) {
            iVar10 = 0;
          }
          else {
            iVar7 = 0;
            iVar10 = 0;
            do {
              puVar12 = (uint32_t *)((long)iVar7 * (long)stride + (long)puVar11);
              iVar5 = WebPRescaleNeededLines(dec->rescaler,iVar1 - iVar7);
              WebPMultARGBRows((uint8_t *)puVar12,stride,dec->rescaler->src_width,iVar5,0);
              iVar5 = WebPRescalerImport(dec->rescaler,iVar1 - iVar7,(uint8_t *)puVar12,stride);
              pWVar4 = dec->rescaler;
              iVar6 = 0;
              if (pWVar4->dst_y < pWVar4->dst_height) {
                puVar12 = (uint32_t *)pWVar4->dst;
                iVar9 = pWVar4->dst_width;
                rgba = rgba_00 + iVar10 * lVar8;
                iVar6 = 0;
                do {
                  if (0 < pWVar4->y_accum) break;
                  WebPRescalerExportRow(pWVar4);
                  (*WebPMultARGBRow)(puVar12,iVar9,1);
                  VP8LConvertFromBGRA(puVar12,iVar9,out_colorspace,rgba);
                  rgba = rgba + lVar8;
                  iVar6 = iVar6 + 1;
                } while (pWVar4->dst_y < pWVar4->dst_height);
              }
              iVar7 = iVar7 + iVar5;
              iVar10 = iVar10 + iVar6;
            } while (iVar7 < iVar1);
          }
        }
        dec->last_out_row_ = dec->last_out_row_ + iVar10;
      }
      else {
        if (pVVar2->use_scaling == 0) {
          iVar10 = dec->last_out_row_;
          if (0 < pVVar2->mb_h) {
            iVar1 = pVVar2->mb_w;
            iVar7 = pVVar2->mb_h + 1;
            do {
              ConvertToYUVA(puVar11,iVar1,iVar10,dec->output_);
              puVar11 = (uint32_t *)((long)puVar11 + (long)stride);
              iVar10 = iVar10 + 1;
              iVar7 = iVar7 + -1;
            } while (1 < iVar7);
          }
        }
        else {
          iVar1 = pVVar2->mb_h;
          iVar10 = dec->last_out_row_;
          if (0 < iVar1) {
            iVar7 = 0;
            do {
              iVar5 = WebPRescaleNeededLines(dec->rescaler,iVar1 - iVar7);
              WebPMultARGBRows((uint8_t *)puVar11,stride,dec->rescaler->src_width,iVar5,0);
              iVar6 = WebPRescalerImport(dec->rescaler,iVar1 - iVar7,(uint8_t *)puVar11,stride);
              pWVar4 = dec->rescaler;
              iVar9 = 0;
              if (pWVar4->dst_y < pWVar4->dst_height) {
                puVar12 = (uint32_t *)pWVar4->dst;
                width = pWVar4->dst_width;
                do {
                  if (0 < pWVar4->y_accum) break;
                  WebPRescalerExportRow(pWVar4);
                  (*WebPMultARGBRow)(puVar12,width,1);
                  ConvertToYUVA(puVar12,width,iVar9 + iVar10,dec->output_);
                  iVar9 = iVar9 + 1;
                } while (pWVar4->dst_y < pWVar4->dst_height);
              }
              iVar7 = iVar7 + iVar6;
              puVar11 = (uint32_t *)((long)puVar11 + (long)(iVar5 * stride));
              iVar10 = iVar9 + iVar10;
            } while (iVar7 < iVar1);
          }
        }
        dec->last_out_row_ = iVar10;
      }
    }
  }
  dec->last_row_ = row;
  return;
}

Assistant:

static void ProcessRows(VP8LDecoder* const dec, int row) {
  const uint32_t* const rows = dec->pixels_ + dec->width_ * dec->last_row_;
  const int num_rows = row - dec->last_row_;

  assert(row <= dec->io_->crop_bottom);
  // We can't process more than NUM_ARGB_CACHE_ROWS at a time (that's the size
  // of argb_cache_), but we currently don't need more than that.
  assert(num_rows <= NUM_ARGB_CACHE_ROWS);
  if (num_rows > 0) {    // Emit output.
    VP8Io* const io = dec->io_;
    uint8_t* rows_data = (uint8_t*)dec->argb_cache_;
    const int in_stride = io->width * sizeof(uint32_t);  // in unit of RGBA
    ApplyInverseTransforms(dec, dec->last_row_, num_rows, rows);
    if (!SetCropWindow(io, dec->last_row_, row, &rows_data, in_stride)) {
      // Nothing to output (this time).
    } else {
      const WebPDecBuffer* const output = dec->output_;
      if (WebPIsRGBMode(output->colorspace)) {  // convert to RGBA
        const WebPRGBABuffer* const buf = &output->u.RGBA;
        uint8_t* const rgba =
            buf->rgba + (int64_t)dec->last_out_row_ * buf->stride;
        const int num_rows_out =
#if !defined(WEBP_REDUCE_SIZE)
         io->use_scaling ?
            EmitRescaledRowsRGBA(dec, rows_data, in_stride, io->mb_h,
                                 rgba, buf->stride) :
#endif  // WEBP_REDUCE_SIZE
            EmitRows(output->colorspace, rows_data, in_stride,
                     io->mb_w, io->mb_h, rgba, buf->stride);
        // Update 'last_out_row_'.
        dec->last_out_row_ += num_rows_out;
      } else {                              // convert to YUVA
        dec->last_out_row_ = io->use_scaling ?
            EmitRescaledRowsYUVA(dec, rows_data, in_stride, io->mb_h) :
            EmitRowsYUVA(dec, rows_data, in_stride, io->mb_w, io->mb_h);
      }
      assert(dec->last_out_row_ <= output->height);
    }
  }

  // Update 'last_row_'.
  dec->last_row_ = row;
  assert(dec->last_row_ <= dec->height_);
}